

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O3

void __thiscall
wasm::SmallVector<unsigned_int,_5UL>::push_back(SmallVector<unsigned_int,_5UL> *this,uint *x)

{
  uint uVar1;
  ulong uVar2;
  iterator __position;
  
  uVar2 = this->usedFixed;
  if (uVar2 < 5) {
    uVar1 = *x;
    this->usedFixed = uVar2 + 1;
    (this->fixed)._M_elems[uVar2] = uVar1;
  }
  else {
    __position._M_current =
         (this->flexible).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->flexible).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->flexible,__position,x);
      return;
    }
    *__position._M_current = *x;
    (this->flexible).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void push_back(const T& x) {
    if (usedFixed < N) {
      fixed[usedFixed++] = x;
    } else {
      flexible.push_back(x);
    }
  }